

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall sf::Font::Font(Font *this,Font *copy)

{
  _Base_ptr p_Var1;
  undefined8 *in_RSI;
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000020;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar2;
  
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = *in_RSI;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = in_RSI[1];
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
    *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_allocated_capacity =
       in_RSI[2];
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)in_RSI[3];
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)in_RSI[4];
  *(byte *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = *(byte *)(in_RSI + 5) & 1;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
            *)(in_RDI + 1);
  Info::Info((Info *)in_RDI,(Info *)paVar2);
  std::
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::map(in_RDI,(map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
                *)paVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_00000020,in_stack_00000018);
  if ((in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    p_Var1 = (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    p_Var1->_M_color = p_Var1->_M_color + _S_black;
  }
  return;
}

Assistant:

Font::Font(const Font& copy) :
m_library    (copy.m_library),
m_face       (copy.m_face),
m_streamRec  (copy.m_streamRec),
m_stroker    (copy.m_stroker),
m_refCount   (copy.m_refCount),
m_isSmooth   (copy.m_isSmooth),
m_info       (copy.m_info),
m_pages      (copy.m_pages),
m_pixelBuffer(copy.m_pixelBuffer)
{
    #ifdef SFML_SYSTEM_ANDROID
        m_stream = NULL;
    #endif

    // Note: as FreeType doesn't provide functions for copying/cloning,
    // we must share all the FreeType pointers

    if (m_refCount)
        (*m_refCount)++;
}